

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_integrate_error(REF_GRID ref_grid,REF_DBL *interpolation_error,REF_DBL *total_error)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  REF_STATUS RVar2;
  REF_CELL *ppRVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  int cell;
  REF_DBL volume;
  REF_GRID local_c0;
  long local_b8;
  REF_LONG ntet;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  uVar1 = ref_cell_ncell(ref_grid->cell[8],ref_node,&ntet);
  if (uVar1 == 0) {
    local_b8 = ntet;
    ppRVar3 = ref_grid->cell + 3;
    if (0 < ntet) {
      ppRVar3 = ref_grid->cell + 8;
    }
    ref_cell = *ppRVar3;
    *total_error = 0.0;
    local_c0 = ref_grid;
    for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
      RVar2 = ref_cell_nodes(ref_cell,cell,nodes);
      if (RVar2 == 0) {
        if (local_b8 < 1) {
          uVar1 = ref_node_tri_area(ref_node,nodes,&volume);
          if (uVar1 != 0) {
            pcVar7 = "area";
            uVar6 = 0x41c;
            goto LAB_0019bdd3;
          }
        }
        else {
          uVar1 = ref_node_tet_vol(ref_node,nodes,&volume);
          if (uVar1 != 0) {
            pcVar7 = "vol";
            uVar6 = 0x41a;
            goto LAB_0019bdd3;
          }
        }
        uVar1 = ref_cell->node_per;
        uVar4 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar4 = 0;
        }
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          if (ref_node->ref_mpi->id == ref_node->part[nodes[uVar5]]) {
            *total_error = (interpolation_error[nodes[uVar5]] * volume) / (double)(int)uVar1 +
                           *total_error;
          }
        }
      }
    }
    uVar1 = ref_mpi_allsum(local_c0->mpi,total_error,1,3);
    if (uVar1 == 0) {
      return 0;
    }
    pcVar7 = "dbl sum";
    uVar6 = 0x426;
  }
  else {
    pcVar7 = "count";
    uVar6 = 0x410;
  }
LAB_0019bdd3:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar6,
         "ref_metric_integrate_error",(ulong)uVar1,pcVar7);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate_error(REF_GRID ref_grid,
                                              REF_DBL *interpolation_error,
                                              REF_DBL *total_error) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL volume;
  REF_BOOL have_tet;
  REF_LONG ntet;
  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "count");
  have_tet = (0 < ntet);
  if (have_tet) {
    ref_cell = ref_grid_tet(ref_grid);
  } else {
    ref_cell = ref_grid_tri(ref_grid);
  }
  *total_error = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (have_tet) {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    } else {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    }
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        (*total_error) += interpolation_error[nodes[cell_node]] * volume /
                          ((REF_DBL)ref_cell_node_per(ref_cell));
      }
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), total_error, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}